

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-stats.c
# Opt level: O3

sexp_conflict sexp_free_sizes(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  sexp_heap_conflict psVar1;
  long lVar2;
  sexp_conflict psVar3;
  sexp_free_list_conflict psVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  sexp_conflict tmp;
  size_t freed;
  sexp_uint_t sizes [512];
  sexp_conflict local_1050;
  sexp_conflict local_1048;
  sexp_gc_var_t local_1040;
  sexp_gc_var_t local_1028;
  long local_1018 [513];
  
  psVar1 = (ctx->value).context.heap;
  local_1050 = (sexp_conflict)0x43e;
  sexp_gc();
  memset(local_1018,0,0x1000);
  for (; psVar1 != (sexp_heap_conflict)0x0; psVar1 = psVar1->next) {
    for (psVar4 = psVar1->free_list; psVar4 != (sexp_free_list_conflict)0x0; psVar4 = psVar4->next)
    {
      uVar5 = psVar4->size + 0x1f;
      uVar6 = uVar5 >> 5;
      if (0x3fff < uVar5) {
        uVar6 = 0x1ff;
      }
      local_1018[uVar6] = local_1018[uVar6] + 1;
    }
  }
  local_1040.var = &local_1048;
  local_1028.next = &local_1040;
  local_1040.next = (ctx->value).context.saves;
  local_1028.var = &local_1050;
  (ctx->value).context.saves = &local_1028;
  local_1048 = (sexp_conflict)0x23e;
  psVar3 = (sexp_conflict)0x23e;
  lVar7 = 0x3fe;
  do {
    lVar2 = *(long *)((long)local_1018 + lVar7 * 4);
    if (lVar2 != 0) {
      local_1050 = (sexp_conflict)sexp_cons_op(ctx,0,2,lVar7 + 1,lVar2 * 2 + 1);
      psVar3 = (sexp_conflict)sexp_cons_op(ctx,0,2,local_1050,local_1048);
      local_1048 = psVar3;
    }
    lVar7 = lVar7 + -2;
  } while (lVar7 != -2);
  (ctx->value).context.saves = local_1040.next;
  return psVar3;
}

Assistant:

static sexp sexp_free_sizes (sexp ctx, sexp self, sexp_sint_t n) {
  size_t freed;
  sexp_uint_t sizes[512];
  sexp_sint_t i;
  sexp_heap h = sexp_context_heap(ctx);
  sexp_free_list q;
  sexp_gc_var2(res, tmp);

  /* run gc once to remove unused variables */
  sexp_gc(ctx, &freed);

  /* initialize stats */
  for (i=0; i<512; i++)
    sizes[i]=0;

  /* loop over each free block */
  for ( ; h; h=h->next)
    for (q=h->free_list; q; q=q->next)
      sizes[sexp_heap_chunks(q->size) > 511 ? 511 : sexp_heap_chunks(q->size)]++;

  /* build and return results */
  sexp_gc_preserve2(ctx, res, tmp);
  res = SEXP_NULL;
  for (i=511; i>=0; i--)
    if (sizes[i]) {
      tmp = sexp_cons(ctx, sexp_make_fixnum(i), sexp_make_fixnum(sizes[i]));
      res = sexp_cons(ctx, tmp, res);
    }
  sexp_gc_release2(ctx);
  return res;
}